

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O0

RPCHelpMan * createmultisig(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffed58;
  allocator<RPCArg> *this;
  allocator<RPCResult> *this_00;
  RPCArg *this_01;
  UniValue *in_stack_ffffffffffffed60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed90;
  allocator<char> *in_stack_ffffffffffffed98;
  UniValue *in_stack_ffffffffffffeda0;
  undefined7 in_stack_ffffffffffffeda8;
  undefined1 in_stack_ffffffffffffedaf;
  string *in_stack_ffffffffffffedb0;
  undefined7 in_stack_ffffffffffffedb8;
  undefined1 in_stack_ffffffffffffedbf;
  undefined4 in_stack_ffffffffffffedc0;
  Type in_stack_ffffffffffffedc4;
  string *in_stack_ffffffffffffedc8;
  undefined4 in_stack_ffffffffffffedd0;
  Type in_stack_ffffffffffffedd4;
  undefined4 in_stack_ffffffffffffedd8;
  Type in_stack_ffffffffffffeddc;
  RPCArg *in_stack_ffffffffffffede0;
  RPCArgOptions *in_stack_ffffffffffffee00;
  undefined1 *local_11e0;
  undefined1 *local_11c8;
  undefined1 *local_11b0;
  pointer *local_1198;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_02;
  undefined6 in_stack_ffffffffffffefc0;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 local_fb0 [35];
  allocator<char> local_f8d;
  allocator<char> local_f8c;
  allocator<char> local_f8b [2];
  undefined1 local_f89 [9];
  pointer pRStack_f80;
  undefined8 local_f78;
  undefined1 local_f6a;
  undefined1 local_f69 [31];
  undefined1 local_f4a [32];
  allocator<char> local_f2a;
  allocator<char> local_f29 [17];
  undefined8 local_f18;
  allocator<char> local_f0a;
  allocator<char> local_f09;
  size_type local_f08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f00;
  allocator<char> local_eea;
  allocator<char> local_ee9 [31];
  allocator<char> local_eca;
  allocator<char> local_ec9 [29];
  allocator<char> local_eac;
  allocator<char> local_eab [2];
  allocator<char> local_ea9;
  undefined4 local_ea8;
  allocator<char> local_ea1 [32];
  allocator<char> local_e81;
  undefined4 local_e80;
  allocator<char> local_e7a;
  allocator<char> local_e79;
  undefined4 local_e78;
  allocator<char> local_e71 [31];
  allocator<char> local_e52;
  allocator<char> local_e51 [385];
  undefined1 local_cd0 [136];
  undefined1 local_c48 [256];
  undefined1 local_b48 [408];
  RPCHelpMan local_9b0;
  undefined1 local_860;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined1 local_820;
  undefined1 local_81f;
  allocator<RPCArg> local_720 [40];
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined1 local_6e0;
  undefined1 local_6df;
  undefined1 local_6d8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined1 local_698;
  undefined1 local_697;
  undefined1 local_5f0 [264];
  undefined1 local_4e8 [160];
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  local_e78 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffed68,&in_stack_ffffffffffffed60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffed70);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffed58);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                 in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffedbf,in_stack_ffffffffffffedb8),
                 in_stack_ffffffffffffedb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  local_e80 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffed68,&in_stack_ffffffffffffed60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  local_ea8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffed68,&in_stack_ffffffffffffed60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  local_6d8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffed70);
  local_6b0 = 0;
  uStack_6a8 = 0;
  local_6a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffed58);
  local_698 = 0;
  local_697 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                 in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffedbf,in_stack_ffffffffffffedb8),
                 in_stack_ffffffffffffedb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffed58);
  __l._M_len._0_7_ = in_stack_ffffffffffffeda8;
  __l._M_array = (iterator)in_stack_ffffffffffffeda0;
  __l._M_len._7_1_ = in_stack_ffffffffffffedaf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffed98,__l,
             (allocator_type *)in_stack_ffffffffffffed90);
  local_720[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffed70);
  local_6f8 = 0;
  uStack_6f0 = 0;
  local_6e8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffed58);
  local_6e0 = 0;
  local_6df = 0;
  this = local_720;
  RPCArg::RPCArg(in_stack_ffffffffffffede0,
                 (string *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8),
                 in_stack_ffffffffffffedd4,(Fallback *)in_stack_ffffffffffffedc8,
                 (string *)CONCAT44(in_stack_ffffffffffffedc4,in_stack_ffffffffffffedc0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffedbf,in_stack_ffffffffffffedb8),
                 in_stack_ffffffffffffee00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  UniValue::UniValue<const_char_(&)[7],_char[7],_true>
            (in_stack_ffffffffffffeda0,(char (*) [7])in_stack_ffffffffffffed98);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffed68,in_stack_ffffffffffffed60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  local_860 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffed70);
  local_838 = 0;
  uStack_830 = 0;
  local_828 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  local_820 = 0;
  local_81f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                 in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffedbf,in_stack_ffffffffffffedb8),
                 in_stack_ffffffffffffedb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8));
  std::allocator<RPCArg>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffeda8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffeda0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffedaf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffed98,__l_00,
             (allocator_type *)in_stack_ffffffffffffed90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  local_f08 = 0;
  aStack_f00._M_allocated_capacity = 0;
  aStack_f00._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffede0,in_stack_ffffffffffffeddc,
             (string *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
             in_stack_ffffffffffffedc8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffedc4,in_stack_ffffffffffffedc0),
             (bool)in_stack_ffffffffffffedbf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  local_f29[1] = (allocator<char>)0x0;
  local_f29[2] = (allocator<char>)0x0;
  local_f29[3] = (allocator<char>)0x0;
  local_f29[4] = (allocator<char>)0x0;
  local_f29[5] = (allocator<char>)0x0;
  local_f29[6] = (allocator<char>)0x0;
  local_f29[7] = (allocator<char>)0x0;
  local_f29[8] = (allocator<char>)0x0;
  local_f29[9] = (allocator<char>)0x0;
  local_f29[10] = (allocator<char>)0x0;
  local_f29[0xb] = (allocator<char>)0x0;
  local_f29[0xc] = (allocator<char>)0x0;
  local_f29[0xd] = (allocator<char>)0x0;
  local_f29[0xe] = (allocator<char>)0x0;
  local_f29[0xf] = (allocator<char>)0x0;
  local_f29[0x10] = (allocator<char>)0x0;
  local_f18._0_1_ = '\0';
  local_f18._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffede0,in_stack_ffffffffffffeddc,
             (string *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
             in_stack_ffffffffffffedc8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffedc4,in_stack_ffffffffffffedc0),
             (bool)in_stack_ffffffffffffedbf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  local_f4a._2_8_ = 0;
  local_f4a._10_8_ = 0;
  local_f4a._18_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffede0,in_stack_ffffffffffffeddc,
             (string *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
             in_stack_ffffffffffffedc8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffedc4,in_stack_ffffffffffffedc0),
             (bool)in_stack_ffffffffffffedbf);
  this_02 = &local_9b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  name = (string *)local_f4a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  description = (string *)local_f69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_f6a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  local_f89._1_8_ = (pointer)0x0;
  pRStack_f80 = (pointer)0x0;
  local_f78 = 0;
  results = (RPCResults *)(local_f89 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffede0,in_stack_ffffffffffffeddc,
             (string *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
             in_stack_ffffffffffffedc8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffedc4,in_stack_ffffffffffffedc0),
             (bool)in_stack_ffffffffffffedbf);
  uVar2 = 0;
  examples = (RPCExamples *)local_f89;
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffeda8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffeda0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffedaf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed98,__l_01,
             (allocator_type *)in_stack_ffffffffffffed90);
  this_00 = (allocator<RPCResult> *)((ulong)this & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8),
             in_stack_ffffffffffffedd4,in_stack_ffffffffffffedc8,
             SUB41(in_stack_ffffffffffffedc4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffedbf,in_stack_ffffffffffffedb8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffedb0,
             (bool)in_stack_ffffffffffffedaf);
  uVar1 = 0;
  std::allocator<RPCResult>::allocator(this_00);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffeda8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffeda0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffedaf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed98,__l_02,
             (allocator_type *)in_stack_ffffffffffffed90);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffede0,in_stack_ffffffffffffeddc,
             (string *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
             in_stack_ffffffffffffedc8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffedc4,in_stack_ffffffffffffedc0),
             (bool)in_stack_ffffffffffffedbf);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  HelpExampleCli(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
  std::operator+((char *)in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
  std::operator+(in_stack_ffffffffffffed70,(char *)in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),
             (char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  HelpExampleRpc(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
  std::operator+(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
  RPCExamples::RPCExamples((RPCExamples *)this_00,(string *)0x68696e);
  this_01 = (RPCArg *)local_fb0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<createmultisig()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffed68,(anon_class_1_0_00000001 *)in_stack_ffffffffffffed60);
  RPCHelpMan::RPCHelpMan
            (this_02,name,description,args,results,examples,
             (RPCMethodImpl *)CONCAT17(uVar2,CONCAT16(uVar1,in_stack_ffffffffffffefc0)));
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_01);
  RPCExamples::~RPCExamples((RPCExamples *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_fb0 + 0x22));
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_f8d);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_f8c);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_f8b);
  RPCResults::~RPCResults((RPCResults *)this_01);
  RPCResult::~RPCResult((RPCResult *)this_01);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed68);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_1198 = (pointer *)
               ((long)&local_9b0.m_results.m_results.
                       super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                       super__Vector_impl_data + 0x10);
  do {
    local_1198 = local_1198 + -0x11;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_1198 != (pointer *)local_b48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed68);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_11b0 = local_c48;
  do {
    local_11b0 = local_11b0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_11b0 != local_cd0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed68);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_f6a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_f69);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_f4a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_f4a + 1));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed68);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_f2a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_f29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed68);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_f0a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_f09);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed68);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_eea);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_ee9);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_eca);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_ec9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffed68);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_01);
  local_11c8 = local_48;
  do {
    local_11c8 = local_11c8 + -0x108;
    RPCArg::~RPCArg(this_01);
  } while (local_11c8 != local_360);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_eac);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  UniValue::~UniValue((UniValue *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_eab);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffed68);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_01);
  local_11e0 = local_4e8;
  do {
    local_11e0 = local_11e0 + -0x108;
    RPCArg::~RPCArg(this_01);
  } while (local_11e0 != local_5f0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_ea9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_ea1);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_e81);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_e7a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_e79);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_e71);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_e52);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_e51);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan createmultisig()
{
    return RPCHelpMan{"createmultisig",
        "\nCreates a multi-signature address with n signature of m keys required.\n"
        "It returns a json object with the address and redeemScript.\n",
        {
            {"nrequired", RPCArg::Type::NUM, RPCArg::Optional::NO, "The number of required signatures out of the n keys."},
            {"keys", RPCArg::Type::ARR, RPCArg::Optional::NO, "The hex-encoded public keys.",
                {
                    {"key", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "The hex-encoded public key"},
                }},
            {"address_type", RPCArg::Type::STR, RPCArg::Default{"legacy"}, "The address type to use. Options are \"legacy\", \"p2sh-segwit\", and \"bech32\"."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "address", "The value of the new multisig address."},
                {RPCResult::Type::STR_HEX, "redeemScript", "The string value of the hex-encoded redemption script."},
                {RPCResult::Type::STR, "descriptor", "The descriptor for this multisig"},
                {RPCResult::Type::ARR, "warnings", /*optional=*/true, "Any warnings resulting from the creation of this multisig",
                {
                    {RPCResult::Type::STR, "", ""},
                }},
            }
        },
        RPCExamples{
            "\nCreate a multisig address from 2 public keys\n"
            + HelpExampleCli("createmultisig", "2 \"[\\\"03789ed0bb717d88f7d321a368d905e7430207ebbd82bd342cf11ae157a7ace5fd\\\",\\\"03dbc6764b8884a92e871274b87583e6d5c2a58819473e17e107ef3f6aa5a61626\\\"]\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("createmultisig", "2, [\"03789ed0bb717d88f7d321a368d905e7430207ebbd82bd342cf11ae157a7ace5fd\",\"03dbc6764b8884a92e871274b87583e6d5c2a58819473e17e107ef3f6aa5a61626\"]")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            int required = request.params[0].getInt<int>();

            // Get the public keys
            const UniValue& keys = request.params[1].get_array();
            std::vector<CPubKey> pubkeys;
            for (unsigned int i = 0; i < keys.size(); ++i) {
                pubkeys.push_back(HexToPubKey(keys[i].get_str()));
            }

            // Get the output type
            OutputType output_type = OutputType::LEGACY;
            if (!request.params[2].isNull()) {
                std::optional<OutputType> parsed = ParseOutputType(request.params[2].get_str());
                if (!parsed) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Unknown address type '%s'", request.params[2].get_str()));
                } else if (parsed.value() == OutputType::BECH32M) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "createmultisig cannot create bech32m multisig addresses");
                }
                output_type = parsed.value();
            }

            FlatSigningProvider keystore;
            CScript inner;
            const CTxDestination dest = AddAndGetMultisigDestination(required, pubkeys, output_type, keystore, inner);

            // Make the descriptor
            std::unique_ptr<Descriptor> descriptor = InferDescriptor(GetScriptForDestination(dest), keystore);

            UniValue result(UniValue::VOBJ);
            result.pushKV("address", EncodeDestination(dest));
            result.pushKV("redeemScript", HexStr(inner));
            result.pushKV("descriptor", descriptor->ToString());

            UniValue warnings(UniValue::VARR);
            if (descriptor->GetOutputType() != output_type) {
                // Only warns if the user has explicitly chosen an address type we cannot generate
                warnings.push_back("Unable to make chosen address type, please ensure no uncompressed public keys are present.");
            }
            PushWarnings(warnings, result);

            return result;
        },
    };
}